

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Market.cpp
# Opt level: O2

Order * __thiscall Market::find(Market *this,Side side,string *id)

{
  __type_conflict _Var1;
  _Base_ptr p_Var2;
  undefined8 *puVar3;
  
  if (side == sell) {
    for (p_Var2 = (this->m_askOrders)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(this->m_askOrders)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &p_Var2[1]._M_parent,id);
      if (_Var1) {
        return (Order *)&p_Var2[1]._M_parent;
      }
    }
  }
  else if (side == buy) {
    for (p_Var2 = (this->m_bidOrders)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var2 != &(this->m_bidOrders)._M_t._M_impl.super__Rb_tree_header;
        p_Var2 = (_Base_ptr)std::_Rb_tree_increment(p_Var2)) {
      _Var1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &p_Var2[1]._M_parent,id);
      if (_Var1) {
        return (Order *)&p_Var2[1]._M_parent;
      }
    }
  }
  puVar3 = (undefined8 *)__cxa_allocate_exception(8);
  *puVar3 = FIX::DoubleConvertor::fast_fixed_dtoa;
  __cxa_throw(puVar3,&std::exception::typeinfo,std::exception::~exception);
}

Assistant:

Order &Market::find(Order::Side side, std::string id) {
  if (side == Order::buy) {
    BidOrders::iterator i;
    for (i = m_bidOrders.begin(); i != m_bidOrders.end(); ++i) {
      if (i->second.getClientID() == id) {
        return i->second;
      }
    }
  } else if (side == Order::sell) {
    AskOrders::iterator i;
    for (i = m_askOrders.begin(); i != m_askOrders.end(); ++i) {
      if (i->second.getClientID() == id) {
        return i->second;
      }
    }
  }
  throw std::exception();
}